

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmq.c
# Opt level: O2

int nni_lmq_resize(nni_lmq *lmq,size_t cap)

{
  ulong uVar1;
  int iVar2;
  nng_msg *in_RAX;
  ulong uVar3;
  nng_msg **ppnVar4;
  size_t sVar5;
  size_t sVar6;
  nng_msg *local_38;
  nng_msg *msg;
  
  uVar1 = 2;
  do {
    uVar3 = uVar1;
    uVar1 = uVar3 * 2;
  } while (uVar3 < cap);
  local_38 = in_RAX;
  ppnVar4 = (nng_msg **)nni_alloc(uVar3 * 8);
  if (ppnVar4 == (nng_msg **)0x0) {
    iVar2 = 2;
  }
  else {
    sVar5 = 0;
    while ((sVar6 = cap, cap != sVar5 &&
           (iVar2 = nni_lmq_get(lmq,&local_38), sVar6 = sVar5, iVar2 == 0))) {
      ppnVar4[sVar5] = local_38;
      sVar5 = sVar5 + 1;
    }
    nni_lmq_flush(lmq);
    if (lmq->lmq_alloc != 0) {
      nni_free(lmq->lmq_msgs,lmq->lmq_alloc << 3);
    }
    lmq->lmq_msgs = ppnVar4;
    lmq->lmq_cap = cap;
    lmq->lmq_alloc = uVar3;
    lmq->lmq_mask = uVar3 - 1;
    lmq->lmq_len = sVar6;
    lmq->lmq_put = sVar6;
    lmq->lmq_get = 0;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
nni_lmq_resize(nni_lmq *lmq, size_t cap)
{
	nng_msg  *msg;
	nng_msg **new_q;
	size_t    alloc;
	size_t    len;

	alloc = 2;
	while (alloc < cap) {
		alloc *= 2;
	}

	if ((new_q = nni_alloc(sizeof(nng_msg *) * alloc)) == NULL) {
		return (NNG_ENOMEM);
	}

	len = 0;
	while ((len < cap) && (nni_lmq_get(lmq, &msg) == 0)) {
		new_q[len++] = msg;
	}

	// Flush anything left over.
	nni_lmq_flush(lmq);

	if (lmq->lmq_alloc > 0) {
		nni_free(lmq->lmq_msgs, lmq->lmq_alloc * sizeof(nng_msg *));
	}
	lmq->lmq_msgs  = new_q;
	lmq->lmq_cap   = cap;
	lmq->lmq_alloc = alloc;
	lmq->lmq_mask  = alloc - 1;
	lmq->lmq_len   = len;
	lmq->lmq_put   = len;
	lmq->lmq_get   = 0;

	return (0);
}